

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O1

bool Game::addTileOnGameboard(GameBoard *gb)

{
  ulong uVar1;
  pointer puVar2;
  pointer puVar3;
  uint uVar4;
  result_type rVar5;
  tile_t *ptVar6;
  uint uVar7;
  point2D_t *pt;
  pointer ptVar8;
  pointer ptVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> index_list_of_free_tiles;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  pointer *local_88;
  undefined1 local_80 [32];
  long local_60;
  pointer *local_58;
  vector<Game::tile_t,_std::allocator<Game::tile_t>_> local_50;
  unsigned_long local_38;
  
  std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::vector
            (&local_50,(vector<Game::tile_t,_std::allocator<Game::tile_t>_> *)gb);
  local_38 = (gb->gbda).
             super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
             .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  if (local_50.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_50.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_88 = &local_50.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    ptVar8 = (pointer)0x0;
    ptVar9 = local_50.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (ptVar9->value == 0) {
        local_80._16_8_ = ptVar8;
        if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&local_a8,
                     (iterator)
                     local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)(local_80 + 0x10));
        }
        else {
          *local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)ptVar8;
          local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      ptVar8 = (pointer)((long)&ptVar8->value + 1);
      ptVar9 = ptVar9 + 1;
    } while (ptVar9 != local_50.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_50.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  puVar3 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::vector
              ((vector<Game::tile_t,_std::allocator<Game::tile_t>_> *)(local_80 + 0x10),
               (vector<Game::tile_t,_std::allocator<Game::tile_t>_> *)gb);
    local_88 = (pointer *)
               (gb->gbda).
               super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
               .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    local_58 = local_88;
    if ((pointer)local_80._16_8_ != (pointer)0x0) {
      operator_delete((void *)local_80._16_8_,local_60 - local_80._16_8_);
    }
    local_80._0_8_ = 1;
    local_80._8_8_ = (pointer)0x7fffffff00000000;
    uVar4 = std::chrono::_V2::system_clock::now();
    uVar7 = uVar4 / 0x7fffffff << 0x1f | uVar4 / 0x7fffffff;
    local_80._0_8_ = ZEXT48(uVar7 + uVar4 + (uint)(uVar4 + uVar7 == 0));
    rVar5 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)(local_80 + 8),
                       (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
                       local_80,(param_type *)(local_80 + 8));
    uVar1 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start
            [(ulong)(long)rVar5 %
             (ulong)((long)local_a8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_a8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3)];
    local_80._0_8_ = 1;
    local_80._8_8_ = (pointer)0x7fffffff00000000;
    uVar4 = std::chrono::_V2::system_clock::now();
    uVar7 = uVar4 / 0x7fffffff << 0x1f | uVar4 / 0x7fffffff;
    local_80._0_8_ = ZEXT48(uVar7 + uVar4 + (uint)(uVar4 + uVar7 == 0));
    rVar5 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)(local_80 + 8),
                       (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
                       local_80,(param_type *)(local_80 + 8));
    uVar1 = (ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff;
    pt = (point2D_t *)((long)uVar1 % (long)(int)local_88 << 0x20);
    local_80._0_8_ = (long)uVar1 / (long)(int)local_88 & 0xffffffffU | (ulong)pt;
    ptVar6 = anon_unknown_0::gameboard_data_point_t::operator()
                       ((gameboard_data_point_t *)gb,(gameboard_data_array_t *)local_80,pt);
    ptVar6->value = (ulong)(0x59 < rVar5 % 100) * 2 + 2;
  }
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return puVar3 == puVar2;
}

Assistant:

bool addTileOnGameboard(GameBoard &gb) {
  return addTileOnGameboardDataArray(gb.gbda);
}